

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall AI::HierarchicalTaskNetworkComponent::decide(HierarchicalTaskNetworkComponent *this)

{
  Planner *plan;
  Utility *pUVar1;
  char *__s;
  char *pcVar2;
  pointer pTVar3;
  pointer pcVar4;
  TaskIdentifier TVar5;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *taskDatabase;
  mapped_type *pmVar6;
  int iVar7;
  Utility *pUVar8;
  TaskIdentifier goal;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  key_type local_d0;
  undefined4 uStack_cc;
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  taskDatabase = GameMode::getAvailableTasks(this_01);
  plan = &this->planner;
  if (((this->planner).plan.finished == false) &&
     ((this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if ((this->planner).plan.failed == true) {
      fixFailedPlan(&plan->plan,&this->state,&(this->planner).parameters,taskDatabase);
      if ((this->planner).plan.failed != true) goto LAB_0012d8ef;
      pUVar1 = (this->utilityIterator)._M_current;
      pUVar8 = pUVar1 + 1;
      (this->utilityIterator)._M_current = pUVar8;
      if ((pUVar8 == (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>
                     ._M_impl.super__Vector_impl_data._M_finish) || (pUVar1[1].score <= 0.0)) {
        createPlan(this,Null);
        goto LAB_0012d8ba;
      }
      createPlan(this,pUVar8->task);
      pUVar8 = (this->utilityIterator)._M_current;
    }
    else {
      local_d0 = Null;
      if ((this->state).memory.sensoryMemory.
          super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->state).memory.sensoryMemory.
          super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0012d8ef;
      local_d0 = evaluateNeeds(this);
      if ((4 < local_d0 - React_Dismiss) ||
         (this->currentGoal == local_d0 && 0xfffffffa < this->currentGoal - TrackHead))
      goto LAB_0012d8ef;
      pUVar8 = (Utility *)&this->currentGoal;
      Actor::getName_abi_cxx11_(&local_70,(this->super_Component).owner);
      pmVar6 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&taskDatabase->tasks,(key_type *)pUVar8);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar4 = (pmVar6->debugName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar4,pcVar4 + (pmVar6->debugName)._M_string_length);
      pmVar6 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&taskDatabase->tasks,&local_d0);
      pcVar4 = (pmVar6->debugName)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + (pmVar6->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*,std::__cxx11::string>
                ("[",&local_70,"] ","Aborted goal: ",&local_f0," for reaction: ",&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      executeFinally(&plan->plan,&this->state);
      this->currentGoal = local_d0;
      updateTaskHistory(this);
      createPlan(this,this->currentGoal);
    }
    pmVar6 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&taskDatabase->tasks,&pUVar8->task);
    std::__cxx11::string::operator=
              ((string *)&this->currentGoalName,(pmVar6->debugName)._M_dataplus._M_p);
  }
  else {
    executeFinally(&plan->plan,&this->state);
    TVar5 = evaluateNeeds(this);
    this->currentGoal = TVar5;
    Actor::getName_abi_cxx11_(&local_50,(this->super_Component).owner);
    pmVar6 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&taskDatabase->tasks,&this->currentGoal);
    pcVar4 = (pmVar6->debugName)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + (pmVar6->debugName)._M_string_length);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_50,"] ","New goal: ",&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    updateTaskHistory(this);
    createPlan(this,this->currentGoal);
LAB_0012d8ba:
    pmVar6 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&taskDatabase->tasks,&this->currentGoal);
    __s = (pmVar6->debugName)._M_dataplus._M_p;
    pcVar2 = (char *)(this->currentGoalName)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->currentGoalName,0,pcVar2,(ulong)__s);
  }
LAB_0012d8ef:
  if (((this->planner).plan.failed == false) &&
     (((this->planner).plan.finished != true || (this->currentGoal != Null)))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               (((this->planner).plan.currentTask._M_current)->debugName)._M_dataplus._M_p,&local_f1
              );
    std::__cxx11::string::operator=((string *)&this->currentTaskName,(string *)&local_d0);
    if ((long *)CONCAT44(uStack_cc,local_d0) != local_c0) {
      operator_delete((long *)CONCAT44(uStack_cc,local_d0),local_c0[0] + 1);
    }
  }
  if (((((this->planner).plan.finished == true) && (this->currentGoal != Null)) &&
      (pTVar3 = (plan->plan).tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                super__Vector_impl_data._M_start, pTVar3->identifier != Null)) &&
     (1 < (ulong)(((long)(this->planner).plan.tasks.
                         super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                 -0x4e6a171024e6a171))) {
    decide(this);
  }
  iVar7 = 0;
  if (this->frameCount < 0x1e) {
    iVar7 = this->frameCount + 1;
  }
  this->frameCount = iVar7;
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::decide()
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();

	if (planner.plan.finished || planner.plan.tasks.empty())
	{
		executeFinally(planner.plan, state);

		currentGoal = evaluateNeeds();

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
		log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[currentGoal].debugName);
#endif

		updateTaskHistory();		

		createPlan(currentGoal);

		currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
	}	
	else if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			utilityIterator++;

			if (utilityIterator != end(utilities) && utilityIterator->score > 0.f)
			{
				createPlan(utilityIterator->task);
				currentGoalName = tasks.tasks[utilityIterator->task].debugName.c_str();
			}
			else
			{
				createPlan(TaskIdentifier::Null);
				currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
			}				
		}
	}	
	else
	{
		bool abortGoal {false};
		TaskIdentifier goal {TaskIdentifier::Null};

		if (planner.plan.currentTask->action != Action::PlayMontage
			&& frameCount == 30
			&& !isReaction(currentGoal)
			&& false //TODO: consider removing the once-a-second task switch check with a emotions based check
			) //check once a second			
			//don't look for a better goal if we're currently playing a montage
		{
			//check if something higher priority can be done if we're just waiting
			goal = evaluateNeeds();

			if (goal != currentGoal)
			{
				abortGoal = true;

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[goal].debugName);
#endif

			}
		}
		else if (!state.memory.sensoryMemory.empty())
		{
			goal = evaluateNeeds();

			if (isReaction(goal))
			{
				if ((isReaction(currentGoal) && currentGoal != goal)
					|| !isReaction(currentGoal))
				{
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
					log("[", owner->getName(), "] ", "Aborted goal: ", tasks.tasks[currentGoal].debugName, " for reaction: ", tasks.tasks[goal].debugName);
#endif

					abortGoal = true;
				}
			}
		}

		if (abortGoal)
		{
			executeFinally(planner.plan, state);

			currentGoal = goal;
			
			updateTaskHistory();			

			createPlan(currentGoal);
			/*AIOwner->StopMovement();
			AIOwner->ClearFocus(EAIFocusPriority::Gameplay);
			*/

			currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
		}
	}				
	
	if (!planner.plan.failed && (!planner.plan.finished || currentGoal != TaskIdentifier::Null))
	{
		currentTaskName = std::string(planner.plan.currentTask->debugName.c_str());
	}

	if (planner.plan.finished && currentGoal != TaskIdentifier::Null
		&& planner.plan.tasks[0].identifier != TaskIdentifier::Null
		&& planner.plan.tasks.size() > 1)
	{
		decide();
	}	

	frameCount++;

	if (frameCount > 30)
	{
		frameCount = 0;
	}
}